

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<double>_>::Contribute_v2
          (TPZDohrSubstruct<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *v2)

{
  int64_t iVar1;
  pair<int,_int> *ppVar2;
  complex<double> *this_00;
  long in_RDI;
  int64_t col;
  int64_t in_XMM1_Qa;
  pair<int,_int> ind;
  int neqs;
  int i;
  TPZDohrSubstruct<std::complex<double>_> *in_stack_000002f0;
  complex<double> *in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  pair<int,_int> this_01;
  undefined4 local_14;
  
  SolveSystemZi(in_stack_000002f0);
  iVar1 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x628));
  for (local_14 = 0; local_14 < (int)iVar1; local_14 = local_14 + 1) {
    ppVar2 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x628),(long)local_14);
    this_01 = *ppVar2;
    this_00 = TPZVec<std::complex<double>_>::operator[]
                        ((TPZVec<std::complex<double>_> *)(in_RDI + 0x4b0),(long)this_01.first);
    TPZFMatrix<std::complex<double>_>::operator()
              ((TPZFMatrix<std::complex<double>_> *)this_01,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
    std::operator*(in_stack_ffffffffffffffb8,(complex<double> *)0x2002cb8);
    in_stack_ffffffffffffffd0 = col;
    in_stack_ffffffffffffffd8 = in_XMM1_Qa;
    TPZFMatrix<std::complex<double>_>::operator()
              ((TPZFMatrix<std::complex<double>_> *)this_01,in_XMM1_Qa,col);
    std::complex<double>::operator+=(this_00,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2(TPZFMatrix<TVar> &v2) {
	int i;
	SolveSystemZi();
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fzi(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		v2(ind.second,0) += fWeights[ind.first] * fzi(ind.first,0);
	}
}